

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

char * http_lookup_type(char *path)

{
  bool bVar1;
  int iVar2;
  char *in_RAX;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  long lVar5;
  char *local_38;
  
  sVar3 = strlen(path);
  __s = ".ai";
  lVar5 = 0x10;
  local_38 = in_RAX;
  while( true ) {
    sVar4 = strlen(__s);
    bVar1 = false;
    if (sVar4 <= sVar3) {
      iVar2 = nni_strcasecmp(path + (sVar3 - sVar4),__s);
      bVar1 = false;
      if (iVar2 == 0) {
        local_38 = *(char **)((long)&http_schemes[0xc].lower + lVar5);
        bVar1 = true;
      }
    }
    if (bVar1) break;
    __s = *(char **)((long)&content_map[0].ext + lVar5);
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x200) {
      return (char *)0x0;
    }
  }
  return local_38;
}

Assistant:

const char *
http_lookup_type(const char *path)
{
	size_t l1 = strlen(path);
	for (int i = 0; content_map[i].ext != NULL; i++) {
		size_t l2 = strlen(content_map[i].ext);
		if (l2 > l1) {
			continue;
		}
		if (nni_strcasecmp(&path[l1 - l2], content_map[i].ext) == 0) {
			return (content_map[i].typ);
		}
	}
	return (NULL);
}